

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bwd.hh
# Opt level: O3

void tchecker::ts::prev<tchecker::syncprod::syncprod_t>
               (syncprod_t *bwd_impl,const_state_t *s,
               vector<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>_>_>
               *v,state_status_t mask)

{
  bool bVar1;
  incoming_edges_iterator_t __begin0;
  incoming_edges_range_t in_edges;
  sync_edges_t local_2f0;
  incoming_edges_iterator_t local_2a8;
  incoming_edges_iterator_t local_170;
  
  syncprod::syncprod_t::incoming_edges((incoming_edges_range_t *)&local_170,bwd_impl,s);
  syncprod::incoming_edges_iterator_t::incoming_edges_iterator_t(&local_2a8,&local_170);
  while( true ) {
    bVar1 = syncprod::vloc_edges_iterator_t::operator==
                      (&local_2a8._it,(end_iterator_t *)&past_the_end_iterator);
    if (bVar1) break;
    syncprod::incoming_edges_iterator_t::operator*(&local_2f0,&local_2a8);
    syncprod::syncprod_t::prev(bwd_impl,s,&local_2f0,v,mask);
    range_t<tchecker::syncprod::edges_iterator_t,_tchecker::syncprod::edges_iterator_t>::~range_t
              (&local_2f0.edges);
    syncprod::incoming_edges_iterator_t::operator++(&local_2a8);
  }
  syncprod::incoming_edges_iterator_t::~incoming_edges_iterator_t(&local_2a8);
  syncprod::incoming_edges_iterator_t::~incoming_edges_iterator_t(&local_170);
  return;
}

Assistant:

void prev(BWD_IMPL & bwd_impl, typename BWD_IMPL::const_state_t const & s, std::vector<typename BWD_IMPL::sst_t> & v,
          tchecker::state_status_t mask)
{
  typename BWD_IMPL::incoming_edges_range_t in_edges = bwd_impl.incoming_edges(s);
  for (typename BWD_IMPL::incoming_edges_value_t && in_edge : in_edges)
    bwd_impl.prev(s, in_edge, v, mask);
}